

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O1

void __thiscall
Fl_PostScript_Graphics_Driver::arc
          (Fl_PostScript_Graphics_Driver *this,double x,double y,double r,double start,double a)

{
  char *format;
  
  if (this->shape_ != 0) {
    this->gap_ = 0;
    format = "%g %g %g %g %g arcn\n";
    if (a < start) {
      format = "%g %g %g %g %g arc\n";
    }
    clocale_printf(this,format);
    return;
  }
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::arc(double x, double y, double r, double start, double a){
  if(shape_==NONE) return;
  gap_=0;
  if(start>a)
    clocale_printf("%g %g %g %g %g arc\n", x , y , r , -start, -a);
  else
    clocale_printf("%g %g %g %g %g arcn\n", x , y , r , -start, -a);
  
}